

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clump.cpp
# Opt level: O3

Sphere * __thiscall rw::Atomic::getWorldBoundingSphere(Atomic *this)

{
  uint8 *puVar1;
  Frame *this_00;
  Matrix *m;
  
  this_00 = (Frame *)(this->object).object.parent;
  if ((((this_00->root->object).privateFlags & 3) != 0) ||
     (((this->object).object.privateFlags & 1) != 0)) {
    m = Frame::getLTM(this_00);
    V3d::transformPoints(&(this->worldBoundingSphere).center,&(this->boundingSphere).center,1,m);
    (this->worldBoundingSphere).radius = (this->boundingSphere).radius;
    puVar1 = &(this->object).object.privateFlags;
    *puVar1 = *puVar1 & 0xfe;
  }
  return &this->worldBoundingSphere;
}

Assistant:

Sphere*
Atomic::getWorldBoundingSphere(void)
{
	Sphere *s = &this->worldBoundingSphere;
	// TODO: if we ever support morphing, check interpolation
	if(!this->getFrame()->dirty() &&
	   (this->object.object.privateFlags & WORLDBOUNDDIRTY) == 0)
		return s;
	Matrix *ltm = this->getFrame()->getLTM();
	// TODO: support scaling
	V3d::transformPoints(&s->center, &this->boundingSphere.center, 1, ltm);
	s->radius = this->boundingSphere.radius;
	this->object.object.privateFlags &= ~WORLDBOUNDDIRTY;
	return s;
}